

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::splatI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  undefined1 local_1a8 [8];
  LaneArray<16> lanes;
  
  if ((this->type).id == 2) {
    lVar1 = 0;
    memset(local_1a8,0,0x180);
    do {
      this_00 = (Literal *)(local_1a8 + lVar1);
      if (this_00 != this) {
        ~Literal(this_00);
        Literal(this_00,this);
      }
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x180);
    Literal(__return_storage_ptr__,(LaneArray<16> *)local_1a8);
    lVar1 = 0x168;
    do {
      ~Literal((Literal *)(local_1a8 + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x683,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 16]");
}

Assistant:

Literal Literal::splatI8x16() const { return splat<Type::i32, 16>(*this); }